

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::POMDPX::ExactInitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          POMDPX *this)

{
  Parser *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  const_reference ppPVar4;
  undefined4 extraout_var;
  double dVar5;
  value_type local_40;
  value_type local_38;
  POMDPXState *state;
  uint local_20;
  undefined1 local_19;
  int s;
  POMDPX *this_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  
  local_19 = 0;
  _s = this;
  this_local = (POMDPX *)__return_storage_ptr__;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  for (local_20 = 0; uVar1 = local_20, iVar3 = (*(this->super_MDP)._vptr_MDP[2])(), uVar2 = local_20
      , (int)uVar1 < iVar3; local_20 = local_20 + 1) {
    this_00 = this->parser_;
    ppPVar4 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::operator[]
                        (&this->states_,(long)(int)local_20);
    dVar5 = Parser::InitialWeight(this_00,&(*ppPVar4)->vec_id);
    iVar3 = (*(this->super_MDP)._vptr_MDP[0x19])(dVar5,this,(ulong)uVar2);
    local_38 = (value_type)CONCAT44(extraout_var,iVar3);
    if ((local_38->weight != 0.0) || (NAN(local_38->weight))) {
      ppPVar4 = std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::
                operator[](&this->states_,(long)(int)local_20);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(local_38 + 1),&(*ppPVar4)->vec_id);
      local_40 = local_38;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (__return_storage_ptr__,&local_40);
    }
    else {
      (*(this->super_MDP)._vptr_MDP[0x1b])(this,local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> POMDPX::ExactInitialParticleSet() const {
	vector<State*> particles;

	for (int s = 0; s < NumStates(); s++) {
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(s,
			parser_->InitialWeight(states_[s]->vec_id)));
		if (state->weight == 0) {
			Free(state);
		} else {
			state->vec_id = states_[s]->vec_id;
			particles.push_back(state);
		}
	}

	return particles;
}